

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF16LEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  uchar *processed;
  byte *pbVar7;
  byte *pbVar8;
  ushort *puVar9;
  ushort *puVar10;
  uint uVar11;
  byte bVar12;
  
  iVar3 = *outlen;
  if ((long)iVar3 == 0) {
    *inlenb = 0;
    return 0;
  }
  uVar5 = *inlenb;
  if ((uVar5 & 0x80000001) == 1) {
    uVar5 = uVar5 - 1;
    *inlenb = uVar5;
  }
  pbVar8 = out;
  puVar10 = (ushort *)inb;
  if (2 < uVar5 + 1) {
    pbVar7 = out + iVar3;
    do {
      if ((long)*outlen <= ((long)pbVar8 - (long)out) + 5) break;
      puVar9 = puVar10 + 1;
      uVar1 = *puVar10;
      uVar11 = (uint)uVar1;
      if ((uVar1 & 0xfc00) == 0xd800) {
        if (inb + (ulong)(uint)((int)uVar5 / 2) * 2 <= puVar9) break;
        uVar2 = *puVar9;
        if ((uVar2 & 0xfc00) != 0xdc00) {
          *outlen = (int)((long)pbVar8 - (long)out);
          *inlenb = (int)puVar10 - (int)inb;
          return -2;
        }
        puVar9 = puVar10 + 2;
        uVar11 = (uVar1 & 0x3ff) * 0x400 + (uVar2 & 0x3ff) + 0x10000;
      }
      if (pbVar7 <= pbVar8) break;
      if (uVar11 < 0x80) {
        *pbVar8 = (byte)uVar11;
        pbVar8 = pbVar8 + 1;
      }
      else {
        sVar4 = 0x12;
        if (0xffff >= uVar11) {
          sVar4 = 0xc;
        }
        bVar12 = (0xffff < uVar11) << 4 | 0xe0;
        if (uVar11 < 0x800) {
          bVar12 = 0xc0;
        }
        if (uVar11 < 0x800) {
          sVar4 = 6;
        }
        *pbVar8 = (byte)(uVar11 >> sVar4) | bVar12;
        pbVar8 = pbVar8 + 1;
        if (pbVar8 < pbVar7) {
          uVar6 = 0xc;
          if (uVar11 < 0x10000) {
            uVar6 = 6;
          }
          if (uVar11 < 0x800) {
            uVar6 = 0;
          }
          do {
            *pbVar8 = (byte)(uVar11 >> ((byte)uVar6 & 0x1f)) & 0x3f | 0x80;
            pbVar8 = pbVar8 + 1;
            if (uVar6 < 6) break;
            uVar6 = uVar6 - 6;
          } while (pbVar8 < pbVar7);
        }
      }
      puVar10 = puVar9;
    } while (puVar9 < inb + (ulong)(uint)((int)uVar5 / 2) * 2);
  }
  *outlen = (int)pbVar8 - (int)out;
  *inlenb = (int)puVar10 - (int)inb;
  return *outlen;
}

Assistant:

static int
UTF16LEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if (*outlen == 0) {
        *inlenb = 0;
        return(0);
    }
    outend = out + *outlen;
    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend = in + inlen;
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
        if (xmlLittleEndian) {
	    c= *in++;
	} else {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c | (((unsigned int)*tmp) << 8);
	    in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		break;
	    }
	    if (xmlLittleEndian) {
		d = *in++;
	    } else {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d | (((unsigned int)*tmp) << 8);
		in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}